

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::predict(memory_tree *b,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  node *pnVar6;
  uint cn;
  ulong uVar7;
  float fVar8;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> selected_labs;
  float local_a4;
  label_t local_a0;
  float *local_98;
  float *pfStack_90;
  float *local_88;
  size_t sStack_80;
  label_t local_78;
  wclass *pwStack_70;
  wclass *local_68;
  size_t sStack_60;
  v_array<unsigned_int> local_58;
  
  ppVar1 = &ec->l;
  if (b->oas == 0) {
    local_a0 = ppVar1->multi;
    local_a4 = (ec->pred).scalar;
  }
  else {
    local_78 = ppVar1->multi;
    pwStack_70 = (ec->l).cs.costs._end;
    local_68 = (ec->l).cs.costs.end_array;
    sStack_60 = (ec->l).cs.costs.erase_count;
    local_98 = (ec->pred).scalars._begin;
    pfStack_90 = (ec->pred).scalars._end;
    local_88 = (ec->pred).scalars.end_array;
    sStack_80 = (ec->pred).scalars.erase_count;
    local_a4 = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f800000bf800000;
  (ec->l).simple.initial = 0.0;
  pnVar6 = (b->nodes)._begin;
  cn = 0;
  if (pnVar6->internal == 1) {
    uVar4 = (ec->super_example_predict).ft_offset;
    uVar7 = 0;
    do {
      uVar3 = pnVar6->base_router;
      (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar3 + uVar4;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar4 = (ec->super_example_predict).ft_offset - (ulong)(uVar3 * *(int *)(base + 0xe0));
      (ec->super_example_predict).ft_offset = uVar4;
      pnVar6 = (b->nodes)._begin;
      cn = (&pnVar6[uVar7].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
      uVar7 = (ulong)cn;
      pnVar6 = pnVar6 + uVar7;
    } while (pnVar6->internal == 1);
  }
  if (b->oas == 0) {
    (ec->l).multi = local_a0;
    (ec->pred).scalar = local_a4;
  }
  else {
    (ec->pred).scalars.end_array = local_88;
    (ec->pred).scalars.erase_count = sStack_80;
    (ec->pred).scalars._begin = local_98;
    (ec->pred).scalars._end = pfStack_90;
    (ec->l).cs.costs.end_array = local_68;
    (ec->l).cs.costs.erase_count = sStack_60;
    ppVar1->multi = local_78;
    (ec->l).cs.costs._end = pwStack_70;
  }
  iVar2 = b->oas;
  iVar5 = pick_nearest(b,base,cn,ec);
  if (iVar2 == 0) {
    if (iVar5 == -1) {
      uVar3 = 0;
    }
    else {
      uVar3 = ((b->examples)._begin[iVar5]->l).multi.label;
    }
    (ec->pred).multiclass = uVar3;
    if ((ec->l).multi.label != uVar3) {
      ec->loss = ec->weight;
      b->num_mistakes = b->num_mistakes + 1;
    }
  }
  else {
    if (iVar5 != -1) {
      fVar8 = F1_score_for_two_examples(ec,(b->examples)._begin[iVar5]);
      b->F1_score = fVar8 + b->F1_score;
    }
    local_58.end_array = (uint *)0x0;
    local_58.erase_count = 0;
    local_58._begin = (uint *)0x0;
    local_58._end = (uint *)0x0;
    uVar3 = compute_hamming_loss_via_oas(b,base,cn,ec,&local_58);
    ec->loss = (float)uVar3;
    b->hamming_loss = (float)uVar3 + b->hamming_loss;
  }
  return;
}

Assistant:

void predict(memory_tree& b, single_learner& base, example& ec)
    {  
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }


        uint32_t cn = 0;
        ec.l.simple = {-1.f, 1.f, 0.};
        while(b.nodes[cn].internal == 1){ //if it's internal{
            base.predict(ec, b.nodes[cn].base_router);
            uint32_t newcn = ec.pred.scalar < 0 ? b.nodes[cn].left : b.nodes[cn].right; //do not need to increment nl and nr.
            cn = newcn;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds; 
            ec.l.multilabels = multilabels;
        }

        int64_t closest_ec = 0;
        if(b.oas == false){
            closest_ec = pick_nearest(b, base, cn, ec);
            if (closest_ec != -1)
                ec.pred.multiclass = b.examples[closest_ec]->l.multi.label;
            else
                ec.pred.multiclass = 0;
            
            if (ec.l.multi.label != ec.pred.multiclass){
                ec.loss = ec.weight;
                b.num_mistakes++;
            }
        }
        else{
            float reward = 0.f;
            closest_ec = pick_nearest(b, base, cn, ec); 
            if (closest_ec != -1){
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
                b.F1_score += reward;
            }
            v_array<uint32_t> selected_labs = v_init<uint32_t>();
            ec.loss = compute_hamming_loss_via_oas(b, base, cn, ec, selected_labs);
            b.hamming_loss += ec.loss;
        }
    }